

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

_Bool SocketIsDead(curl_socket_t sock)

{
  int iVar1;
  _Bool ret_val;
  int sval;
  curl_socket_t sock_local;
  
  iVar1 = Curl_socket_check(sock,-1,-1,0);
  return iVar1 != 0;
}

Assistant:

static bool SocketIsDead(curl_socket_t sock)
{
  int sval;
  bool ret_val = TRUE;

  sval = SOCKET_READABLE(sock, 0);
  if(sval == 0)
    /* timeout */
    ret_val = FALSE;

  return ret_val;
}